

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void satoko_rollback(satoko_t *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vec_uint_t *pvVar4;
  uint *puVar5;
  byte *pbVar6;
  vec_wl_t *pvVar7;
  vec_char_t *pvVar8;
  void *__ptr;
  char *__function;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  char *__file;
  char *__assertion;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  vec_uint_t *pvVar16;
  
  if (s->status != 1) {
    __assert_fail("s->status == SATOKO_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x204,"void satoko_rollback(satoko_t *)");
  }
  if (s->trail_lim->size != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x205,"void satoko_rollback(satoko_t *)");
  }
  if (s->book_vars == 0) {
    satoko_reset(s);
    return;
  }
  pvVar16 = s->originals;
  uVar1 = pvVar16->size;
  uVar14 = s->book_cl_orig;
  uVar9 = (ulong)uVar14;
  pvVar4 = s->learnts;
  uVar2 = pvVar4->size;
  uVar3 = s->book_cl_lrnt;
  uVar15 = (ulong)uVar3;
  uVar13 = (ulong)((uVar2 - uVar3) + (uVar1 - uVar14));
  __ptr = malloc(uVar13 * 8);
  if (uVar14 < uVar1) {
    puVar5 = pvVar16->data;
    do {
      if ((ulong)puVar5[uVar9] == 0xffffffff) {
        puVar11 = (uint *)0x0;
      }
      else {
        puVar11 = s->all_clauses->data + puVar5[uVar9];
      }
      *(uint **)((long)__ptr + uVar9 * 8) = puVar11;
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  if (uVar3 < uVar2) {
    puVar5 = pvVar4->data;
    do {
      uVar9 = (ulong)puVar5[uVar15];
      if (uVar9 == 0xffffffff) {
        puVar11 = (uint *)0x0;
      }
      else {
        puVar11 = s->all_clauses->data + uVar9;
      }
      *(uint **)((long)__ptr + (ulong)((uVar1 - uVar14) + (int)uVar15) * 8) = puVar11;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
  }
  if (uVar13 != 0) {
    uVar9 = 0;
    do {
      pbVar6 = *(byte **)((long)__ptr + uVar9 * 8);
      clause_unwatch(s,(uint)((ulong)((long)pbVar6 - (long)s->all_clauses->data) >> 2));
      *pbVar6 = *pbVar6 | 2;
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar13);
    pvVar16 = s->originals;
    uVar14 = s->book_cl_orig;
  }
  free(__ptr);
  if (uVar14 <= pvVar16->cap) {
    pvVar16->size = uVar14;
    if (s->book_cl_lrnt <= s->learnts->cap) {
      s->learnts->size = s->book_cl_lrnt;
      uVar1 = s->book_vars;
      uVar9 = (ulong)uVar1;
      pvVar7 = s->watches;
      pvVar8 = s->assigns;
      iVar10 = uVar1 + pvVar8->size * -2;
      if (uVar1 < pvVar8->size * 2) {
        uVar14 = pvVar7->cap;
        if (pvVar7->cap < uVar1) {
          uVar14 = uVar1;
        }
        lVar12 = uVar9 * 0x18 + 8;
        do {
          if (uVar14 == uVar9) {
            __assert_fail("idx < vec_wl->cap",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                          ,0xc5,"struct watch_list *vec_wl_at(vec_wl_t *, unsigned int)");
          }
          if (pvVar7->size <= uVar9) {
            __assert_fail("idx < vec_wl->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                          ,0xc6,"struct watch_list *vec_wl_at(vec_wl_t *, unsigned int)");
          }
          *(undefined8 *)((long)pvVar7->watch_lists + lVar12 + -4) = 0;
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x18;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
      }
      pvVar7->size = uVar1;
      if (s->activity->cap < uVar1) {
        __assert_fail("new_size <= p->cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
                      ,0x5b,"void vec_sdbl_shrink(vec_sdbl_t *, unsigned int)");
      }
      s->activity->size = uVar1;
      if (uVar1 <= s->levels->cap) {
        s->levels->size = uVar1;
        if (uVar1 <= s->reasons->cap) {
          s->reasons->size = uVar1;
          if (uVar1 <= s->stamps->cap) {
            s->stamps->size = uVar1;
            if (uVar1 < pvVar8->cap) {
              pvVar8->size = uVar1;
              if (uVar1 < s->seen->cap) {
                s->seen->size = uVar1;
                if (uVar1 < s->polarity->cap) {
                  s->polarity->size = uVar1;
                  solver_rebuild_order(s);
                  solver_cancel_until(s,0);
                  if (s->book_trail <= s->trail->cap) {
                    s->trail->size = s->book_trail;
                    if (s->book_cdb != 0) {
                      s->all_clauses->size = s->book_cdb;
                    }
                    s->book_cl_orig = 0;
                    s->book_cl_lrnt = 0;
                    s->book_vars = 0;
                    s->book_trail = 0;
                    return;
                  }
                  goto LAB_0055f885;
                }
              }
            }
            __assertion = "p->cap > new_size";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_char.h"
            ;
            __function = "void vec_char_shrink(vec_char_t *, unsigned int)";
            goto LAB_0055f8b1;
          }
        }
      }
    }
  }
LAB_0055f885:
  __assertion = "p->cap >= new_size";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
  ;
  __function = "void vec_uint_shrink(vec_uint_t *, unsigned int)";
LAB_0055f8b1:
  __assert_fail(__assertion,__file,0x65,__function);
}

Assistant:

void satoko_rollback(satoko_t *s)
{
    unsigned i, cref;
    unsigned n_originals = vec_uint_size(s->originals) - s->book_cl_orig;
    unsigned n_learnts = vec_uint_size(s->learnts) - s->book_cl_lrnt;
    struct clause **cl_to_remove;

    // printf("[Satoko] rollback.\n");
    assert(s->status == SATOKO_OK);
    assert(solver_dlevel(s) == 0);
    if (!s->book_vars) {
        satoko_reset(s);
        return;
    }
    cl_to_remove = satoko_alloc(struct clause *, n_originals + n_learnts);
    /* Mark clauses */
    vec_uint_foreach_start(s->originals, cref, i, s->book_cl_orig)
        cl_to_remove[i] = clause_fetch(s, cref);
    vec_uint_foreach_start(s->learnts, cref, i, s->book_cl_lrnt)
        cl_to_remove[n_originals + i] = clause_fetch(s, cref);
    for (i = 0; i < n_originals + n_learnts; i++) {
        clause_unwatch(s, cdb_cref(s->all_clauses, (unsigned *)cl_to_remove[i]));
        cl_to_remove[i]->f_mark = 1;
    }
    satoko_free(cl_to_remove);
    vec_uint_shrink(s->originals, s->book_cl_orig);
    vec_uint_shrink(s->learnts, s->book_cl_lrnt);
    /* Shrink variable related vectors */
    for (i = s->book_vars; i < 2 * vec_char_size(s->assigns); i++) {
        vec_wl_at(s->watches, i)->size = 0;
        vec_wl_at(s->watches, i)->n_bin = 0;
    }
    // s->i_qhead = s->book_qhead;
    s->watches->size = s->book_vars;
    vec_act_shrink(s->activity, s->book_vars);
    vec_uint_shrink(s->levels, s->book_vars);
    vec_uint_shrink(s->reasons, s->book_vars);
    vec_uint_shrink(s->stamps, s->book_vars);
    vec_char_shrink(s->assigns, s->book_vars);
    vec_char_shrink(s->seen, s->book_vars);
    vec_char_shrink(s->polarity, s->book_vars);
    solver_rebuild_order(s);
    /* Rewind solver and cancel level 0 assignments to the trail */
    solver_cancel_until(s, 0);
    vec_uint_shrink(s->trail, s->book_trail);
    if (s->book_cdb)
        s->all_clauses->size = s->book_cdb;
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    // s->book_qhead = 0;
}